

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cpp
# Opt level: O3

void yyensure_buffer_stack(void)

{
  size_t sVar1;
  YY_BUFFER_STATE *ppyVar2;
  
  sVar1 = yy_buffer_stack_max;
  if (yy_buffer_stack == (YY_BUFFER_STATE *)0x0) {
    yy_buffer_stack = (YY_BUFFER_STATE *)malloc(8);
    if (yy_buffer_stack == (YY_BUFFER_STATE *)0x0) {
LAB_0015821f:
      yy_fatal_error("out of dynamic memory in yyensure_buffer_stack()");
    }
    *yy_buffer_stack = (YY_BUFFER_STATE)0x0;
    yy_buffer_stack_max = 1;
    yy_buffer_stack_top = 0;
  }
  else if (yy_buffer_stack_max - 1 <= yy_buffer_stack_top) {
    ppyVar2 = (YY_BUFFER_STATE *)realloc(yy_buffer_stack,yy_buffer_stack_max * 8 + 0x40);
    yy_buffer_stack = ppyVar2;
    if (ppyVar2 == (YY_BUFFER_STATE *)0x0) goto LAB_0015821f;
    yy_buffer_stack_max = sVar1 + 8;
    ppyVar2[sVar1 + 6] = (YY_BUFFER_STATE)0x0;
    (ppyVar2 + sVar1 + 6)[1] = (YY_BUFFER_STATE)0x0;
    ppyVar2[sVar1 + 4] = (YY_BUFFER_STATE)0x0;
    (ppyVar2 + sVar1 + 4)[1] = (YY_BUFFER_STATE)0x0;
    ppyVar2[sVar1 + 2] = (YY_BUFFER_STATE)0x0;
    (ppyVar2 + sVar1 + 2)[1] = (YY_BUFFER_STATE)0x0;
    ppyVar2[sVar1] = (YY_BUFFER_STATE)0x0;
    (ppyVar2 + sVar1)[1] = (YY_BUFFER_STATE)0x0;
  }
  return;
}

Assistant:

static void yyensure_buffer_stack (void)
{
	yy_size_t num_to_alloc;
    
	if (!(yy_buffer_stack)) {

		/* First allocation is just for 2 elements, since we don't know if this
		 * scanner will even need a stack. We use 2 instead of 1 to avoid an
		 * immediate realloc on the next call.
         */
      num_to_alloc = 1; /* After all that talk, this was set to 1 anyways... */
		(yy_buffer_stack) = (struct yy_buffer_state**)yyalloc
								(num_to_alloc * sizeof(struct yy_buffer_state*)
								);
		if ( ! (yy_buffer_stack) )
			YY_FATAL_ERROR( "out of dynamic memory in yyensure_buffer_stack()" );

		memset((yy_buffer_stack), 0, num_to_alloc * sizeof(struct yy_buffer_state*));

		(yy_buffer_stack_max) = num_to_alloc;
		(yy_buffer_stack_top) = 0;
		return;
	}

	if ((yy_buffer_stack_top) >= ((yy_buffer_stack_max)) - 1){

		/* Increase the buffer to prepare for a possible push. */
		yy_size_t grow_size = 8 /* arbitrary grow size */;

		num_to_alloc = (yy_buffer_stack_max) + grow_size;
		(yy_buffer_stack) = (struct yy_buffer_state**)yyrealloc
								((yy_buffer_stack),
								num_to_alloc * sizeof(struct yy_buffer_state*)
								);
		if ( ! (yy_buffer_stack) )
			YY_FATAL_ERROR( "out of dynamic memory in yyensure_buffer_stack()" );

		/* zero only the new slots.*/
		memset((yy_buffer_stack) + (yy_buffer_stack_max), 0, grow_size * sizeof(struct yy_buffer_state*));
		(yy_buffer_stack_max) = num_to_alloc;
	}
}